

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::portmap_log_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,portmap_log_alert *this)

{
  undefined8 uVar1;
  _Alloc_hider _Var2;
  char *pcVar3;
  size_t sVar4;
  char ret [1024];
  string local_448;
  char local_428 [1032];
  
  uVar1 = *(undefined8 *)((anonymous_namespace)::nat_type_str + (ulong)this->map_transport * 8);
  boost::asio::ip::address::to_string_abi_cxx11_(&local_448,&(this->local_address).super_address);
  _Var2._M_p = local_448._M_dataplus._M_p;
  pcVar3 = aux::stack_allocator::ptr
                     ((this->m_alloc)._M_data,(allocation_slot)(this->m_log_idx).m_idx);
  snprintf(local_428,0x400,"%s [%s]: %s",uVar1,_Var2._M_p,pcVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar4 = strlen(local_428);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_428,local_428 + sVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string portmap_log_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char ret[1024];
		std::snprintf(ret, sizeof(ret), "%s [%s]: %s"
			, nat_type_str[static_cast<int>(map_transport)]
			, local_address.to_string().c_str()
			, log_message());
		return ret;
#endif
	}